

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageProcessing.cpp
# Opt level: O3

void drawLine(Vec2f *line,Mat *img,Scalar *rgb)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  int local_50 [2];
  int local_48;
  undefined4 local_44;
  int local_40 [2];
  undefined4 local_38;
  int local_34;
  undefined4 local_30;
  Mat *local_28;
  undefined8 local_20;
  
  fVar6 = (line->super_Matx<float,_2,_1>).val[1];
  if ((fVar6 != 0.0) || (NAN(fVar6))) {
    fVar4 = tanf(fVar6);
    fVar6 = (line->super_Matx<float,_2,_1>).val[0];
    fVar5 = sinf((line->super_Matx<float,_2,_1>).val[1]);
    fVar6 = fVar6 / fVar5;
    local_34 = (int)fVar6;
    local_38 = 0;
    iVar1 = *(int *)(*(long *)(img + 0x40) + 4);
    iVar3 = (int)((float)iVar1 * (-1.0 / fVar4) + fVar6);
    piVar2 = local_40;
  }
  else {
    iVar1 = (int)(line->super_Matx<float,_2,_1>).val[0];
    local_44 = 0;
    iVar3 = **(int **)(img + 0x40);
    piVar2 = local_50;
    local_48 = iVar1;
  }
  local_20 = 0;
  local_30 = 0x3010000;
  *piVar2 = iVar1;
  piVar2[1] = iVar3;
  local_28 = img;
  cv::line();
  return;
}

Assistant:

void drawLine(Vec2f line, Mat &img, Scalar rgb = CV_RGB(0,0,255)){
    if(line[1]!=0){
        float m = -1/tan(line[1]);

        float c = line[0]/sin(line[1]);

        cv::line(img, Point(0, c), Point(img.size().width, m*img.size().width+c), rgb);
    }
    else{
        cv::line(img, Point(line[0], 0), Point(line[0], img.size().height), rgb);
    }

}